

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::
     ArgMinMaxNUpdate<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,_duckdb::MinMaxFixedValue<double>,_duckdb::LessThan>
  **ppAVar4;
  idx_t iVar5;
  undefined8 uVar6;
  long *plVar7;
  long in_RSI;
  Vector *in_RDI;
  idx_t in_R8;
  TYPE_conflict val_val;
  TYPE_conflict2 arg_val;
  long nval;
  idx_t nidx;
  ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,_duckdb::MinMaxFixedValue<double>,_duckdb::LessThan>
  *state;
  idx_t state_idx;
  idx_t val_idx;
  idx_t arg_idx;
  idx_t i;
  ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,_duckdb::MinMaxFixedValue<double>,_duckdb::LessThan>
  **states;
  EXTRA_STATE arg_extra_state;
  EXTRA_STATE val_extra_state;
  UnifiedVectorFormat state_format;
  UnifiedVectorFormat n_format;
  UnifiedVectorFormat arg_format;
  UnifiedVectorFormat val_format;
  Vector *n_vector;
  Vector *arg_vector;
  Vector *val_vector;
  UnifiedVectorFormat *in_stack_fffffffffffffd78;
  UnifiedVectorFormat *pUVar8;
  UnifiedVectorFormat *in_stack_fffffffffffffd80;
  ArenaAllocator *in_stack_fffffffffffffd88;
  Vector *in_stack_fffffffffffffd90;
  allocator *paVar9;
  long in_stack_fffffffffffffdb0;
  undefined5 in_stack_fffffffffffffdb8;
  InvalidInputException *in_stack_fffffffffffffdc0;
  allocator local_229;
  string local_228 [38];
  undefined1 local_202;
  allocator local_201;
  string local_200 [32];
  long local_1e0;
  undefined1 local_1d2;
  allocator local_1d1;
  string local_1d0 [16];
  UnifiedVectorFormat *in_stack_fffffffffffffe40;
  idx_t in_stack_fffffffffffffe48;
  Vector *in_stack_fffffffffffffe50;
  ulong local_188;
  UnifiedVectorFormat local_170;
  UnifiedVectorFormat local_128;
  SelectionVector *local_d0;
  SelectionVector *local_88;
  Vector *local_40;
  Vector *local_38;
  Vector *local_30;
  idx_t local_28;
  long local_10;
  
  local_38 = in_RDI + 1;
  local_40 = in_RDI + 2;
  local_30 = in_RDI;
  local_28 = in_R8;
  local_10 = in_RSI;
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffd90);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffd90);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffd90);
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffd90);
  MinMaxFixedValue<long>::CreateExtraState(local_30,local_28);
  MinMaxFixedValue<double>::CreateExtraState(local_38,local_28);
  MinMaxFixedValue<long>::PrepareData
            (in_stack_fffffffffffffd90,(idx_t)in_stack_fffffffffffffd88,
             (EXTRA_STATE *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  MinMaxFixedValue<double>::PrepareData
            (in_stack_fffffffffffffd90,(idx_t)in_stack_fffffffffffffd88,
             (EXTRA_STATE *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  Vector::ToUnifiedFormat
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  Vector::ToUnifiedFormat
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  ppAVar4 = UnifiedVectorFormat::
            GetData<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,duckdb::MinMaxFixedValue<double>,duckdb::LessThan>*>
                      (&local_170);
  local_188 = 0;
  do {
    if (local_28 <= local_188) {
      UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffd80);
      UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffd80);
      UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffd80);
      UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffd80);
      return;
    }
    SelectionVector::get_index(local_d0,local_188);
    SelectionVector::get_index(local_88,local_188);
    uVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffd88,
                       (idx_t)in_stack_fffffffffffffd80);
    if (((bool)uVar1) &&
       (uVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffd88,
                           (idx_t)in_stack_fffffffffffffd80), (bool)uVar2)) {
      iVar5 = SelectionVector::get_index(local_170.sel,local_188);
      pUVar8 = (UnifiedVectorFormat *)ppAVar4[iVar5];
      if (((ulong)(pUVar8->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr & 1) == 0) {
        iVar5 = SelectionVector::get_index(local_128.sel,local_188);
        uVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffd88,
                           (idx_t)in_stack_fffffffffffffd80);
        if (!(bool)uVar3) {
          local_1d2 = 1;
          uVar6 = __cxa_allocate_exception(0x10);
          paVar9 = &local_1d1;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_1d0,"Invalid input for arg_min/arg_max: n value cannot be NULL",paVar9);
          InvalidInputException::InvalidInputException
                    ((InvalidInputException *)in_stack_fffffffffffffd80,
                     (string *)in_stack_fffffffffffffd78);
          local_1d2 = 0;
          __cxa_throw(uVar6,&InvalidInputException::typeinfo,
                      InvalidInputException::~InvalidInputException);
        }
        plVar7 = UnifiedVectorFormat::GetData<long>(&local_128);
        local_1e0 = plVar7[iVar5];
        if (local_1e0 < 1) {
          local_202 = 1;
          uVar6 = __cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_200,"Invalid input for arg_min/arg_max: n value must be > 0",&local_201);
          InvalidInputException::InvalidInputException
                    ((InvalidInputException *)in_stack_fffffffffffffd80,
                     (string *)in_stack_fffffffffffffd78);
          local_202 = 0;
          __cxa_throw(uVar6,&InvalidInputException::typeinfo,
                      InvalidInputException::~InvalidInputException);
        }
        if (999999 < local_1e0) {
          uVar6 = __cxa_allocate_exception(0x10);
          paVar9 = &local_229;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_228,"Invalid input for arg_min/arg_max: n value must be < %d",paVar9);
          InvalidInputException::InvalidInputException<long>
                    (in_stack_fffffffffffffdc0,
                     (string *)
                     CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,in_stack_fffffffffffffdb8))),
                     in_stack_fffffffffffffdb0);
          __cxa_throw(uVar6,&InvalidInputException::typeinfo,
                      InvalidInputException::~InvalidInputException);
        }
        in_stack_fffffffffffffd80 = *(UnifiedVectorFormat **)(local_10 + 8);
        UnsafeNumericCast<unsigned_long,long,void>(local_1e0);
        ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,_duckdb::MinMaxFixedValue<double>,_duckdb::LessThan>
        ::Initialize((ArgMinMaxNState<duckdb::MinMaxFixedValue<long>,_duckdb::MinMaxFixedValue<double>,_duckdb::LessThan>
                      *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                     (idx_t)in_stack_fffffffffffffd80);
        in_stack_fffffffffffffd78 = pUVar8;
      }
      MinMaxFixedValue<double>::Create(in_stack_fffffffffffffd80,(idx_t)in_stack_fffffffffffffd78);
      in_stack_fffffffffffffdc0 =
           (InvalidInputException *)
           MinMaxFixedValue<long>::Create
                     (in_stack_fffffffffffffd80,(idx_t)in_stack_fffffffffffffd78);
      BinaryAggregateHeap<double,_long,_duckdb::LessThan>::Insert
                ((BinaryAggregateHeap<double,_long,_duckdb::LessThan> *)in_stack_fffffffffffffd90,
                 in_stack_fffffffffffffd88,(double *)in_stack_fffffffffffffd80,
                 (long *)in_stack_fffffffffffffd78);
    }
    local_188 = local_188 + 1;
  } while( true );
}

Assistant:

static void ArgMinMaxNUpdate(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count, Vector &state_vector,
                             idx_t count) {

	auto &val_vector = inputs[0];
	auto &arg_vector = inputs[1];
	auto &n_vector = inputs[2];

	UnifiedVectorFormat val_format;
	UnifiedVectorFormat arg_format;
	UnifiedVectorFormat n_format;
	UnifiedVectorFormat state_format;

	auto val_extra_state = STATE::VAL_TYPE::CreateExtraState(val_vector, count);
	auto arg_extra_state = STATE::ARG_TYPE::CreateExtraState(arg_vector, count);

	STATE::VAL_TYPE::PrepareData(val_vector, count, val_extra_state, val_format);
	STATE::ARG_TYPE::PrepareData(arg_vector, count, arg_extra_state, arg_format);

	n_vector.ToUnifiedFormat(count, n_format);
	state_vector.ToUnifiedFormat(count, state_format);

	auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);

	for (idx_t i = 0; i < count; i++) {
		const auto arg_idx = arg_format.sel->get_index(i);
		const auto val_idx = val_format.sel->get_index(i);
		if (!arg_format.validity.RowIsValid(arg_idx) || !val_format.validity.RowIsValid(val_idx)) {
			continue;
		}
		const auto state_idx = state_format.sel->get_index(i);
		auto &state = *states[state_idx];

		// Initialize the heap if necessary and add the input to the heap
		if (!state.is_initialized) {
			static constexpr int64_t MAX_N = 1000000;
			const auto nidx = n_format.sel->get_index(i);
			if (!n_format.validity.RowIsValid(nidx)) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value cannot be NULL");
			}
			const auto nval = UnifiedVectorFormat::GetData<int64_t>(n_format)[nidx];
			if (nval <= 0) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value must be > 0");
			}
			if (nval >= MAX_N) {
				throw InvalidInputException("Invalid input for arg_min/arg_max: n value must be < %d", MAX_N);
			}
			state.Initialize(aggr_input.allocator, UnsafeNumericCast<idx_t>(nval));
		}

		// Now add the input to the heap
		auto arg_val = STATE::ARG_TYPE::Create(arg_format, arg_idx);
		auto val_val = STATE::VAL_TYPE::Create(val_format, val_idx);

		state.heap.Insert(aggr_input.allocator, arg_val, val_val);
	}
}